

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

float norm(float *v,int n)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  fVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    fVar3 = fVar3 + v[uVar1] * v[uVar1];
  }
  if (0.0 <= fVar3) {
    return SQRT(fVar3);
  }
  fVar3 = sqrtf(fVar3);
  return fVar3;
}

Assistant:

float norm(float v[],int n)
{
int i;
float sum = 0.0;

for (i=0;i<n; i++)
        sum += (v[i]*v[i]);
sum = (float) sqrt(sum);
return sum;
}